

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chacha20poly1305.h
# Opt level: O0

void chacha20poly1305_finalize(chacha20poly1305_context_t *ctx,uint8_t *tag)

{
  uint8_t local_28 [8];
  uint8_t lenbuf [16];
  uint8_t *tag_local;
  chacha20poly1305_context_t *ctx_local;
  
  lenbuf._8_8_ = tag;
  chacha20poly1305_encrypt_pad(ctx,ctx->textlen);
  chacha20poly1305_write_u64(local_28,ctx->aadlen);
  chacha20poly1305_write_u64(lenbuf,ctx->textlen);
  (*ctx->poly1305_update)(ctx,local_28,0x10);
  (*ctx->poly1305_finish)(ctx,(void *)lenbuf._8_8_);
  return;
}

Assistant:

static void chacha20poly1305_finalize(struct chacha20poly1305_context_t *ctx, uint8_t *tag)
{
    uint8_t lenbuf[16];

    chacha20poly1305_encrypt_pad(ctx, ctx->textlen);

    chacha20poly1305_write_u64(lenbuf, ctx->aadlen);
    chacha20poly1305_write_u64(lenbuf + 8, ctx->textlen);
    ctx->poly1305_update(ctx, lenbuf, sizeof(lenbuf));

    ctx->poly1305_finish(ctx, tag);
}